

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::ScalarReplacementPass::ProcessFunction
          (ScalarReplacementPass *this,Function *function)

{
  bool bVar1;
  Op OVar2;
  Instruction *pIVar3;
  reference ppIVar4;
  Status var_status;
  Instruction *varInst_1;
  Instruction *pIStack_a0;
  Status status;
  Instruction *varInst;
  undefined1 local_90 [8];
  iterator iter;
  BasicBlock *entry;
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  worklist;
  Function *function_local;
  ScalarReplacementPass *this_local;
  
  worklist.c.
  super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)function;
  std::
  queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
  ::queue<std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>,void>
            ((queue<spvtools::opt::Instruction*,std::deque<spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>>>
              *)&entry);
  _iter = opt::Function::begin
                    ((Function *)
                     worklist.c.
                     super__Deque_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node);
  UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
            ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&iter);
  BasicBlock::begin((BasicBlock *)local_90);
  while( true ) {
    BasicBlock::end((BasicBlock *)&varInst);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_90,
                              (iterator_template<spvtools::opt::Instruction> *)&varInst);
    if (!bVar1) break;
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_90);
    OVar2 = opt::Instruction::opcode(pIVar3);
    if (OVar2 != OpVariable) break;
    pIStack_a0 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_90);
    bVar1 = CanReplaceVariable(this,pIStack_a0);
    if (bVar1) {
      std::
      queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::push((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              *)&entry,&stack0xffffffffffffff60);
    }
    InstructionList::iterator::operator++((iterator *)local_90);
  }
  varInst_1._4_4_ = SuccessWithoutChange;
  while (bVar1 = std::
                 queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::empty((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          *)&entry), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar4 = std::
              queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
              ::front((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                       *)&entry);
    pIVar3 = *ppIVar4;
    std::
    queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
    ::pop((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
           *)&entry);
    this_local._4_4_ =
         ReplaceVariable(this,pIVar3,
                         (queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                          *)&entry);
    if (this_local._4_4_ == Failure) goto LAB_0088caa9;
    if (this_local._4_4_ == SuccessWithChange) {
      varInst_1._4_4_ = this_local._4_4_;
    }
  }
  this_local._4_4_ = varInst_1._4_4_;
LAB_0088caa9:
  std::
  queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
  ::~queue((queue<spvtools::opt::Instruction_*,_std::deque<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
            *)&entry);
  return this_local._4_4_;
}

Assistant:

Pass::Status ScalarReplacementPass::ProcessFunction(Function* function) {
  std::queue<Instruction*> worklist;
  BasicBlock& entry = *function->begin();
  for (auto iter = entry.begin(); iter != entry.end(); ++iter) {
    // Function storage class OpVariables must appear as the first instructions
    // of the entry block.
    if (iter->opcode() != spv::Op::OpVariable) break;

    Instruction* varInst = &*iter;
    if (CanReplaceVariable(varInst)) {
      worklist.push(varInst);
    }
  }

  Status status = Status::SuccessWithoutChange;
  while (!worklist.empty()) {
    Instruction* varInst = worklist.front();
    worklist.pop();

    Status var_status = ReplaceVariable(varInst, &worklist);
    if (var_status == Status::Failure)
      return var_status;
    else if (var_status == Status::SuccessWithChange)
      status = var_status;
  }

  return status;
}